

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_aead_context_t *
new_aead(ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,int is_enc,void *secret,
        ptls_iovec_t hash_value,char *label_prefix)

{
  void *__dest;
  ptls_aead_algorithm_t *local_b0 [8];
  int local_6c;
  undefined1 local_68 [4];
  int ret;
  uint8_t key [32];
  ptls_aead_context_t *ctx;
  void *secret_local;
  int is_enc_local;
  ptls_hash_algorithm_t *hash_local;
  ptls_aead_algorithm_t *aead_local;
  ptls_iovec_t hash_value_local;
  
  __dest = malloc(aead->context_size);
  if (__dest == (void *)0x0) {
    hash_value_local.len = 0;
  }
  else {
    key._24_8_ = __dest;
    memset(local_b0,0,0x40);
    local_b0[0] = aead;
    memcpy(__dest,local_b0,0x40);
    local_6c = get_traffic_key(hash,local_68,aead->key_size,0,secret,hash_value,label_prefix);
    if ((local_6c == 0) &&
       (local_6c = get_traffic_key(hash,(void *)(key._24_8_ + 8),aead->iv_size,1,secret,hash_value,
                                   label_prefix), local_6c == 0)) {
      local_6c = (*aead->setup_crypto)((ptls_aead_context_t *)key._24_8_,is_enc,local_68);
    }
    (*ptls_clear_memory)(local_68,aead->key_size);
    if (local_6c != 0) {
      (*ptls_clear_memory)((void *)(key._24_8_ + 8),aead->iv_size);
      free((void *)key._24_8_);
      key[0x18] = '\0';
      key[0x19] = '\0';
      key[0x1a] = '\0';
      key[0x1b] = '\0';
      key[0x1c] = '\0';
      key[0x1d] = '\0';
      key[0x1e] = '\0';
      key[0x1f] = '\0';
    }
    hash_value_local.len._0_1_ = key[0x18];
    hash_value_local.len._1_1_ = key[0x19];
    hash_value_local.len._2_1_ = key[0x1a];
    hash_value_local.len._3_1_ = key[0x1b];
    hash_value_local.len._4_1_ = key[0x1c];
    hash_value_local.len._5_1_ = key[0x1d];
    hash_value_local.len._6_1_ = key[0x1e];
    hash_value_local.len._7_1_ = key[0x1f];
  }
  return (ptls_aead_context_t *)hash_value_local.len;
}

Assistant:

ptls_aead_context_t *new_aead(ptls_aead_algorithm_t *aead, ptls_hash_algorithm_t *hash, int is_enc, const void *secret,
                              ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_aead_context_t *ctx;
    uint8_t key[PTLS_MAX_SECRET_SIZE];
    int ret;

    if ((ctx = (ptls_aead_context_t *)malloc(aead->context_size)) == NULL)
        return NULL;

    *ctx = (ptls_aead_context_t){aead};
    if ((ret = get_traffic_key(hash, key, aead->key_size, 0, secret, hash_value, label_prefix)) != 0)
        goto Exit;
    if ((ret = get_traffic_key(hash, ctx->static_iv, aead->iv_size, 1, secret, hash_value, label_prefix)) != 0)
        goto Exit;
    ret = aead->setup_crypto(ctx, is_enc, key);

Exit:
    ptls_clear_memory(key, aead->key_size);
    if (ret != 0) {
        ptls_clear_memory(ctx->static_iv, aead->iv_size);
        free(ctx);
        ctx = NULL;
    }

    return ctx;
}